

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall duckdb::MetadataBlock::FreeBlocksFromInteger(MetadataBlock *this,idx_t free_list)

{
  pointer puVar1;
  undefined8 in_RAX;
  idx_t index;
  ulong uVar2;
  undefined8 uStack_28;
  
  puVar1 = (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (free_list != 0) {
    uStack_28 = in_RAX;
    for (uVar2 = 0x3f; uVar2 != 0xffffffffffffffff; uVar2 = uVar2 - 1) {
      if ((free_list >> (uVar2 & 0x3f) & 1) != 0) {
        uStack_28 = CONCAT17((char)uVar2,(undefined7)uStack_28);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&(this->free_blocks).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)((long)&uStack_28 + 7));
      }
    }
  }
  return;
}

Assistant:

void MetadataBlock::FreeBlocksFromInteger(idx_t free_list) {
	free_blocks.clear();
	if (free_list == 0) {
		return;
	}
	for (idx_t i = 64; i > 0; i--) {
		auto index = i - 1;
		idx_t mask = idx_t(1) << index;
		if (free_list & mask) {
			free_blocks.push_back(UnsafeNumericCast<uint8_t>(index));
		}
	}
}